

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map_constructor_test.h
# Opt level: O1

void __thiscall
phmap::priv::gtest_suite_ConstructorTest_::
InitializerListBucketHashEqualAlloc<phmap::parallel_flat_hash_map<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_4UL,_phmap::NullMutex>_>
::TestBody(InitializerListBucketHashEqualAlloc<phmap::parallel_flat_hash_map<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_4UL,_phmap::NullMutex>_>
           *this)

{
  size_t sz;
  long lVar1;
  parallel_flat_hash_map<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_4UL,_phmap::NullMutex>
  *m_00;
  char *pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  Generator<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
  gen;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar;
  A alloc;
  E equal;
  H hasher;
  TypeParam m;
  Generator<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
  local_5e9;
  AssertHelper local_5e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_5e0;
  undefined1 local_5d8 [8];
  vector<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_5d0;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_5b8;
  vector<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_5b0;
  allocator_type local_598;
  key_equal local_590;
  hasher local_588;
  undefined4 local_580;
  pointer local_578;
  pointer ppStack_570;
  pointer local_568;
  pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_560;
  pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_538;
  pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_510;
  pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4e8;
  pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4c0;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_498;
  
  hash_internal::
  Generator<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
  ::operator()(&local_560,&local_5e9);
  hash_internal::
  Generator<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
  ::operator()(&local_538,&local_5e9);
  hash_internal::
  Generator<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
  ::operator()(&local_510,&local_5e9);
  hash_internal::
  Generator<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
  ::operator()(&local_4e8,&local_5e9);
  hash_internal::
  Generator<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
  ::operator()(&local_4c0,&local_5e9);
  local_588.super_WithId<phmap::priv::StatefulTestingHash>.id_ =
       (WithId<phmap::priv::StatefulTestingHash>)
       (WithId<phmap::priv::StatefulTestingHash>)
       hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
       next_id<phmap::priv::StatefulTestingHash>()::gId.id_;
  local_590.super_WithId<phmap::priv::StatefulTestingEqual>.id_ =
       (WithId<phmap::priv::StatefulTestingEqual>)
       (WithId<phmap::priv::StatefulTestingEqual>)
       hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
       next_id<phmap::priv::StatefulTestingEqual>()::gId.id_;
  local_598.id_ = 0;
  hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
  next_id<phmap::priv::StatefulTestingHash>()::gId.id_ =
       hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
       next_id<phmap::priv::StatefulTestingHash>()::gId.id_ + 1;
  hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
  next_id<phmap::priv::StatefulTestingEqual>()::gId.id_ =
       hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
       next_id<phmap::priv::StatefulTestingEqual>()::gId.id_ + 1;
  parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::Enum,std::__cxx11::string>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::hash_internal::Enum_const,std::__cxx11::string>>>
  ::parallel_hash_set<std::pair<phmap::priv::hash_internal::Enum_const,std::__cxx11::string>const*>
            ((parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::Enum,std::__cxx11::string>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::hash_internal::Enum_const,std::__cxx11::string>>>
              *)&local_498,&local_560,
             (pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_498,0x7b,&local_588,&local_590,&local_598);
  local_5b8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       local_498.sets_._M_elems[0].set_.settings_.
       super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       .
       super__Tuple_impl<1UL,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       .super__Head_base<1UL,_phmap::priv::StatefulTestingHash,_false>._M_head_impl.
       super_WithId<phmap::priv::StatefulTestingHash>.id_;
  testing::internal::CmpHelperEQ<phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingHash>
            ((internal *)local_5d8,"m.hash_function()","hasher",(StatefulTestingHash *)&local_5b8,
             &local_588);
  if (local_5d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_5b8);
    if (local_5d0.
        super__Vector_base<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_5d0.
                         super__Vector_base<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_5e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_constructor_test.h"
               ,0x158,pcVar2);
    testing::internal::AssertHelper::operator=(&local_5e8,(Message *)&local_5b8);
    testing::internal::AssertHelper::~AssertHelper(&local_5e8);
    if (local_5b8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_5b8._M_head_impl + 8))();
    }
  }
  if (local_5d0.
      super__Vector_base<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_5d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_5d0.
                 super__Vector_base<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
  }
  local_5b8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       local_498.sets_._M_elems[0].set_.settings_.
       super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       .
       super__Tuple_impl<1UL,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       .
       super__Tuple_impl<2UL,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       .super__Head_base<2UL,_phmap::priv::StatefulTestingEqual,_false>._M_head_impl.
       super_WithId<phmap::priv::StatefulTestingEqual>.id_;
  testing::internal::
  CmpHelperEQ<phmap::priv::StatefulTestingEqual,phmap::priv::StatefulTestingEqual>
            ((internal *)local_5d8,"m.key_eq()","equal",(StatefulTestingEqual *)&local_5b8,
             &local_590);
  if (local_5d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_5b8);
    if (local_5d0.
        super__Vector_base<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_5d0.
                         super__Vector_base<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_5e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_constructor_test.h"
               ,0x159,pcVar2);
    testing::internal::AssertHelper::operator=(&local_5e8,(Message *)&local_5b8);
    testing::internal::AssertHelper::~AssertHelper(&local_5e8);
    if (local_5b8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_5b8._M_head_impl + 8))();
    }
  }
  if (local_5d0.
      super__Vector_base<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_5d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_5d0.
                 super__Vector_base<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
  }
  local_5b8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       local_498.sets_._M_elems[0].set_.settings_.
       super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       .
       super__Tuple_impl<1UL,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       .
       super__Tuple_impl<2UL,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       .
       super__Tuple_impl<3UL,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       .
       super__Head_base<3UL,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false>
       ._M_head_impl.id_;
  testing::internal::
  CmpHelperEQ<phmap::priv::Alloc<std::pair<phmap::priv::hash_internal::Enum_const,std::__cxx11::string>>,phmap::priv::Alloc<std::pair<phmap::priv::hash_internal::Enum_const,std::__cxx11::string>>>
            ((internal *)local_5d8,"m.get_allocator()","alloc",
             (Alloc<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_5b8,&local_598);
  if (local_5d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_5b8);
    if (local_5d0.
        super__Vector_base<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_5d0.
                         super__Vector_base<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_5e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_constructor_test.h"
               ,0x15a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_5e8,(Message *)&local_5b8);
    testing::internal::AssertHelper::~AssertHelper(&local_5e8);
    if (local_5b8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_5b8._M_head_impl + 8))();
    }
  }
  if (local_5d0.
      super__Vector_base<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_5d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_5d0.
                 super__Vector_base<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
  }
  local_580 = 3;
  std::
  vector<std::pair<phmap::priv::hash_internal::Enum_const,std::__cxx11::string>,std::allocator<std::pair<phmap::priv::hash_internal::Enum_const,std::__cxx11::string>>>
  ::vector<std::pair<phmap::priv::hash_internal::Enum_const,std::__cxx11::string>const*,void>
            ((vector<std::pair<phmap::priv::hash_internal::Enum_const,std::__cxx11::string>,std::allocator<std::pair<phmap::priv::hash_internal::Enum_const,std::__cxx11::string>>>
              *)&local_578,&local_560,
             (pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_498,(allocator_type *)local_5d8);
  local_5b0.
  super__Vector_base<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = local_568;
  local_5b0.
  super__Vector_base<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = ppStack_570;
  local_5b0.
  super__Vector_base<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = local_578;
  local_5d8._0_4_ = local_580;
  local_568 = (pointer)0x0;
  local_578 = (pointer)0x0;
  ppStack_570 = (pointer)0x0;
  local_5b8._M_head_impl._0_4_ = local_580;
  local_5d0.
  super__Vector_base<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_5d0.
  super__Vector_base<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_5d0.
  super__Vector_base<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_5d0);
  items<phmap::parallel_flat_hash_map<phmap::priv::hash_internal::Enum,std::__cxx11::string,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::hash_internal::Enum_const,std::__cxx11::string>>,4ul,phmap::NullMutex>>
            ((vector<std::pair<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_5d8,(priv *)&local_498,m_00);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<std::pair<phmap::priv::hash_internal::Enum_const,std::__cxx11::string>>>
  ::operator()(&local_5e8,(char *)&local_5b8,
               (vector<std::pair<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)"items(m)");
  std::
  vector<std::pair<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)local_5d8);
  std::
  vector<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_5b0);
  std::
  vector<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)&local_578);
  if ((char)local_5e8.data_ == '\0') {
    testing::Message::Message((Message *)local_5d8);
    if (local_5e0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_5e0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_5b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_constructor_test.h"
               ,0x15b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_5b8,(Message *)local_5d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_5b8);
    if ((long *)CONCAT44(local_5d8._4_4_,local_5d8._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_5d8._4_4_,local_5d8._0_4_) + 8))();
    }
  }
  if (local_5e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_5e0,local_5e0);
  }
  lVar1 = 0x18;
  local_5b8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  do {
    local_5b8._M_head_impl =
         local_5b8._M_head_impl + *(long *)((long)&local_498.sets_._M_elems[0].set_.ctrl_ + lVar1);
    lVar1 = lVar1 + 0x48;
  } while (lVar1 != 0x498);
  local_5e8.data_._0_4_ = 0x7b;
  testing::internal::CmpHelperGE<unsigned_long,int>
            ((internal *)local_5d8,"m.bucket_count()","123",(unsigned_long *)&local_5b8,
             (int *)&local_5e8);
  if (local_5d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_5b8);
    if (local_5d0.
        super__Vector_base<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_5d0.
                         super__Vector_base<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_5e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_constructor_test.h"
               ,0x15c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_5e8,(Message *)&local_5b8);
    testing::internal::AssertHelper::~AssertHelper(&local_5e8);
    if (local_5b8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_5b8._M_head_impl + 8))();
    }
  }
  if (local_5d0.
      super__Vector_base<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_5d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_5d0.
                 super__Vector_base<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
  }
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~parallel_hash_set(&local_498);
  lVar1 = -200;
  paVar3 = &local_4c0.second.field_2;
  do {
    if (paVar3 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(&paVar3->_M_allocated_capacity)[-2]) {
      operator_delete((long *)(&paVar3->_M_allocated_capacity)[-2],paVar3->_M_allocated_capacity + 1
                     );
    }
    paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(&paVar3->_M_allocated_capacity + -5);
    lVar1 = lVar1 + 0x28;
  } while (lVar1 != 0);
  return;
}

Assistant:

TYPED_TEST_P(ConstructorTest, InitializerListBucketHashEqualAlloc) {
  using T = hash_internal::GeneratedType<TypeParam>;
  hash_internal::Generator<T> gen;
  std::initializer_list<T> values = {gen(), gen(), gen(), gen(), gen()};
  using H = typename TypeParam::hasher;
  using E = typename TypeParam::key_equal;
  using A = typename TypeParam::allocator_type;
  H hasher;
  E equal;
  A alloc(0);
  TypeParam m(values, 123, hasher, equal, alloc);
  EXPECT_EQ(m.hash_function(), hasher);
  EXPECT_EQ(m.key_eq(), equal);
  EXPECT_EQ(m.get_allocator(), alloc);
  EXPECT_THAT(items(m), ::testing::UnorderedElementsAreArray(values));
  EXPECT_GE(m.bucket_count(), 123);
}